

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::absolute_pose::modules::upnp_main
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  pointer ppVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  long lVar5;
  Matrix<double,_4,_1,_0,_4,_1> *pMVar6;
  const_iterator __position;
  long lVar7;
  complex<double> *pcVar8;
  ActualDstType actualDst;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 extraout_var [56];
  double dVar14;
  double dVar16;
  undefined1 auVar15 [16];
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> destT;
  Vector4d quaternion;
  Matrix<std::complex<double>,_16,_16,_0,_16,_16> V;
  Matrix<double,_16,_16,_0,_16,_16> Action;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> Eig;
  Scalar local_4560;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> local_4558;
  Transpose<const_Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_4550;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> local_4548;
  undefined1 local_4540 [16];
  double dStack_4530;
  double dStack_4528;
  undefined1 local_4510 [16];
  double dStack_4500;
  double dStack_44f8;
  double dStack_44f0;
  double dStack_44e8;
  double dStack_44e0;
  double dStack_44d8;
  double local_44d0;
  double dStack_44c8;
  undefined1 local_44c0 [32];
  Matrix<double,_1,_10,_1,_1,_10> local_44a0;
  non_const_type local_4450;
  EigenvectorsType local_4440;
  EigenBase<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_3440 [2048];
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_2c40;
  
  upnp::setupAction_gj(M,C,gamma,(Matrix<double,_16,_16,_0,_16,_16> *)local_3440);
  lVar7 = 0;
  local_2c40.m_realSchur.m_hess.m_isInitialized = false;
  local_2c40.m_realSchur.m_isInitialized = false;
  local_2c40.m_realSchur.m_matUisUptodate = false;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[1]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[1]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[2]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[2]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[3]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[3]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[4]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[4]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[5]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[5]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[6]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[6]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[7]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[7]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[8]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[8]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[9]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[9]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[10]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[10]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xb]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xb]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xc]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xc]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xd]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xd]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xe]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xe]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xf]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xf]._M_value._8_8_ = 0;
  local_2c40.m_isInitialized = false;
  local_2c40.m_eigenvectorsOk = false;
  local_2c40.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>::
  compute<Eigen::Matrix<double,16,16,0,16,16>>
            ((EigenSolver<Eigen::Matrix<double,16,16,0,16,16>> *)&local_2c40,local_3440,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_>::eigenvectors
            (&local_4440,&local_2c40);
  pcVar8 = local_4440.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_16,_0,_16,_16>_>
           .m_storage.m_data.array + 0xb;
  do {
    dVar14 = 0.0;
    lVar5 = 0;
    do {
      dVar16 = *(double *)(pcVar8->_M_value + lVar5 * 2);
      *(double *)(local_4540 + lVar5) = dVar16;
      lVar5 = lVar5 + 8;
      dVar14 = dVar14 + dVar16 * dVar16;
    } while (lVar5 != 0x20);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar14;
    if (dVar14 < 0.0) {
      auVar10._0_8_ = sqrt(dVar14);
      auVar10._8_56_ = extraout_var;
      auVar12 = auVar10._0_16_;
    }
    else {
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_4540._0_8_;
    uVar2 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar9,0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar12,auVar4);
    lVar5 = (ulong)bVar3 * auVar9._0_8_ + (ulong)!bVar3 * auVar12._0_8_;
    auVar13._8_8_ = lVar5;
    auVar13._0_8_ = lVar5;
    auVar13._16_8_ = lVar5;
    auVar13._24_8_ = lVar5;
    _local_4540 = vdivpd_avx(_local_4540,auVar13);
    ppVar1 = (quaternions->
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(quaternions->
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 6;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pMVar6 = &ppVar1->second;
      do {
        auVar13 = vsubpd_avx(_local_4540,
                             (undefined1  [32])
                             (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                             m_storage.m_data);
        dVar14 = auVar13._0_8_ * auVar13._0_8_ + auVar13._16_8_ * auVar13._16_8_;
        dVar16 = auVar13._8_8_ * auVar13._8_8_ + auVar13._24_8_ * auVar13._24_8_;
        auVar15._0_8_ = dVar14 + dVar16;
        auVar15._8_8_ = dVar14 + dVar16;
        auVar12 = vsqrtsd_avx(auVar15,auVar15);
        if (auVar12._0_8_ < 1e-08) goto LAB_001599aa;
        pMVar6 = pMVar6 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    auVar13 = vpermpd_avx2(_local_4540,0xe9);
    local_4560 = 1.0;
    auVar10 = vpermpd_avx512f(_DAT_001e3340,ZEXT3264(_local_4540));
    auVar11 = vpermpd_avx512f(_DAT_001e3380,ZEXT3264(_local_4540));
    auVar12 = vshufpd_avx(local_4540._16_16_,local_4540._16_16_,3);
    local_44d0 = auVar13._0_8_ * auVar12._0_8_;
    dStack_44c8 = auVar13._8_8_ * auVar12._8_8_;
    _local_4510 = vmulpd_avx512f(auVar10,auVar11);
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [8] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [9] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [4] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [5] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [6] = 0.0;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [7] = 0.0;
    local_4558.m_matrix.m_matrix = (non_const_type)(non_const_type)local_4510;
    local_4550.m_matrix = M;
    local_4548.m_matrix = &local_44a0;
    local_44c0._16_8_ = &local_44a0;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,10,10,0,10,10>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,10,1,1,10>>>
              (&local_4550,&local_4558,&local_4548,&local_4560);
    local_44c0._0_8_ =
         (double)local_4510._0_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[0] +
         dStack_4500 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[2] +
         dStack_44f0 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[4] +
         local_44d0 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[8] +
         dStack_44e0 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[6] +
         (double)local_4510._8_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[1] +
         dStack_44f8 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[3] +
         dStack_44e8 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[5] +
         dStack_44c8 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[9] +
         dStack_44d8 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->m_storage
         ).m_data.array[7] +
         (double)local_4510._0_8_ *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [0] * 2.0 +
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [2] * 2.0 * dStack_4500 +
         dStack_44f0 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [4] * 2.0 +
         dStack_44e0 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [6] * 2.0 +
         local_44d0 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [8] * 2.0 +
         (double)local_4510._8_8_ *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [1] * 2.0 +
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [3] * 2.0 * dStack_44f8 +
         dStack_44e8 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [5] * 2.0 +
         dStack_44d8 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [7] * 2.0 +
         dStack_44c8 *
         (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
         [9] * 2.0 + gamma;
    for (__position._M_current =
              (quaternions->
              super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        (__position._M_current !=
         (quaternions->
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish &&
        ((__position._M_current)->first < (double)local_44c0._0_8_));
        __position._M_current = __position._M_current + 1) {
    }
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = (double)local_4540._0_8_;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = (double)local_4540._8_8_;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = dStack_4530;
    local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = dStack_4528;
    local_4450 = (non_const_type)local_4510;
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::_M_insert_rval(quaternions,__position,(value_type *)local_44c0);
LAB_001599aa:
    lVar7 = lVar7 + 1;
    pcVar8 = pcVar8 + 0x10;
    if (lVar7 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,16,16> Action;
  upnp::setupAction_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,16,16> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,16,16> V = Eig.eigenvectors();
  
  //cut the double solutions
  double doubleSolThreshold = 0.00000001;
  
  for( int i = 0; i < 16; i++ )
  {
    //we decided to drop the test for imaginary part
    //I've noticed that when the number of points is really low, things get a little
    //weary with noise, and complex solutions might actually be pretty good
    
    Eigen::Vector4d quaternion;
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
    {
      quaternion[q] = V(11+q,i).real();
      norm += pow(quaternion[q],2.0);
    }
    norm = sqrt(norm);
    if(quaternion[0] < 0) // this here is maybe risky, what if quaternion[0] is very small
      norm *= -1.0;
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    bool alreadyThere = false;
    for( size_t s = 0; s < quaternions.size(); s++ )
    {
      Eigen::Vector4d diff = quaternion - quaternions[s].second;
      if( diff.norm() < doubleSolThreshold )
      {
        alreadyThere = true;
        break;
      }
    }
    
    if( !alreadyThere )
    {
      Eigen::Matrix<double,10,1> s;
      upnp_fill_s(quaternion,s);
      Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
      double value = valueM[0] + gamma;
      
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
}